

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Vec_t * Abc_NtkLevelize(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Vec_t *p;
  Abc_Obj_t *pObj_00;
  int local_28;
  int i;
  int nLevels;
  Vec_Vec_t *vLevels;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLevel(pNtk);
  p = Vec_VecStart(iVar1 + 1);
  local_28 = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vObjs);
    if (iVar2 <= local_28) {
      return p;
    }
    pObj_00 = Abc_NtkObj(pNtk,local_28);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0)) {
      if (iVar1 < (int)(*(uint *)&pObj_00->field_0x14 >> 0xc)) {
        __assert_fail("(int)pObj->Level <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x598,"Vec_Vec_t *Abc_NtkLevelize(Abc_Ntk_t *)");
      }
      Vec_VecPush(p,*(uint *)&pObj_00->field_0x14 >> 0xc,pObj_00);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Abc_NtkLevelize( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Abc_NtkLevel( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}